

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void P_SerializePlayers(FSerializer *arc,bool skipload)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  long lVar4;
  char **ppcVar5;
  ulong *puVar6;
  void *pvVar7;
  char *__s1;
  char *pcVar8;
  FPlayerStart *mthing;
  player_t *ppVar9;
  ulong uVar10;
  ulong uVar11;
  char **charptr;
  ulong uVar12;
  int i;
  player_t *ppVar13;
  long *plVar14;
  int iVar15;
  undefined1 *puVar16;
  int numPlayers;
  int local_2e4;
  char *name;
  char *local_2d8;
  char *n;
  DAngle local_118;
  DAngle local_110;
  
  iVar15 = 0;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    iVar15 = iVar15 + (uint)playeringame[lVar4];
  }
  local_2e4 = iVar15;
  if (arc->w == (FWriter *)0x0) {
    FSerializer::operator()(arc,"numplayers",&numPlayers);
    bVar2 = FSerializer::BeginArray(arc,"players");
    iVar3 = numPlayers;
    if (bVar2) {
      uVar11 = (ulong)numPlayers;
      if (uVar11 == 1) {
        name = (char *)0x0;
        bVar2 = FSerializer::BeginObject(arc,(char *)0x0);
        if (bVar2) {
          FSerializer::StringPtr(arc,"playername",&name);
          ppVar13 = (player_t *)&players;
          bVar2 = false;
          for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
            if (playeringame[lVar4] == true) {
              if (bVar2) {
                bVar2 = true;
                if (ppVar13->mo != (APlayerPawn *)0x0) {
                  (*(ppVar13->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
                  ppVar13->mo = (APlayerPawn *)0x0;
                }
              }
              else {
                player_t::player_t((player_t *)&n);
                player_t::Serialize((player_t *)&n,arc);
                if (skipload) {
                  ppVar13->mo = (APlayerPawn *)n;
                }
                else {
                  local_118.Degrees = *(double *)(n + 0xa8);
                  local_110.Degrees = local_118.Degrees;
                  CopyPlayer(ppVar13,(player_t *)&n,name);
                }
                player_t::~player_t((player_t *)&n);
                bVar2 = true;
              }
            }
            ppVar13 = ppVar13 + 1;
          }
          FSerializer::EndObject(arc);
        }
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar11;
        uVar10 = SUB168(auVar1 * ZEXT816(0x2a0),0) | 8;
        if (SUB168(auVar1 * ZEXT816(0x2a0),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        uVar12 = uVar11 * 8;
        if (numPlayers < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        ppcVar5 = (char **)operator_new__(uVar12);
        puVar6 = (ulong *)operator_new__(uVar10);
        ppVar13 = (player_t *)(puVar6 + 1);
        *puVar6 = uVar11;
        if (iVar3 != 0) {
          lVar4 = 0;
          ppVar9 = ppVar13;
          do {
            player_t::player_t(ppVar9);
            lVar4 = lVar4 + -0x2a0;
            ppVar9 = ppVar9 + 1;
          } while (uVar11 * -0x2a0 - lVar4 != 0);
        }
        pvVar7 = operator_new__(uVar11);
        uVar10 = 0;
        uVar11 = 0;
        ppVar9 = ppVar13;
        charptr = ppcVar5;
        if (0 < iVar3) {
          uVar11 = (ulong)(uint)iVar3;
        }
        for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          *charptr = (char *)0x0;
          bVar2 = FSerializer::BeginObject(arc,(char *)0x0);
          if (bVar2) {
            FSerializer::StringPtr(arc,"playername",charptr);
            player_t::Serialize(ppVar9,arc);
            FSerializer::EndObject(arc);
          }
          *(undefined1 *)((long)pvVar7 + uVar10) = 0;
          ppVar9 = ppVar9 + 1;
          charptr = charptr + 1;
        }
        for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
          *(byte *)((long)&n + lVar4) = (playeringame[lVar4] ^ 1U) * '\x02';
        }
        if (skipload) {
          for (lVar4 = 0; lVar4 != 0x1500; lVar4 = lVar4 + 0x2a0) {
            *(undefined8 *)((long)&players + lVar4) = *(undefined8 *)((long)&ppVar13->mo + lVar4);
          }
        }
        else {
          for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
            ppVar9 = (player_t *)&players;
            for (uVar12 = 0; uVar12 != 8; uVar12 = uVar12 + 1) {
              if (*(char *)((long)&n + uVar12) == '\0') {
                __s1 = userinfo_t::GetName(&ppVar9->userinfo);
                pcVar8 = ppcVar5[uVar10];
                iVar3 = strcasecmp(__s1,pcVar8);
                if (iVar3 == 0) {
                  Printf("Found player %d (%s) at %d\n",uVar10 & 0xffffffff,pcVar8,
                         uVar12 & 0xffffffff);
                  CopyPlayer(ppVar9,ppVar13 + uVar10,ppcVar5[uVar10]);
                  *(undefined1 *)((long)&n + uVar12) = 1;
                  *(undefined1 *)((long)pvVar7 + uVar10) = 1;
                  break;
                }
              }
              ppVar9 = ppVar9 + 1;
            }
          }
          for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
            if (*(char *)((long)pvVar7 + uVar10) == '\0') {
              ppVar9 = (player_t *)&players;
              for (uVar12 = 0; uVar12 != 8; uVar12 = uVar12 + 1) {
                if (*(char *)((long)&n + uVar12) == '\0') {
                  local_2d8 = ppcVar5[uVar10];
                  pcVar8 = userinfo_t::GetName(&ppVar9->userinfo);
                  Printf("Assigned player %d (%s) to %d (%s)\n",uVar10 & 0xffffffff,local_2d8,
                         uVar12 & 0xffffffff,pcVar8);
                  CopyPlayer(ppVar9,ppVar13 + uVar10,ppcVar5[uVar10]);
                  *(undefined1 *)((long)&n + uVar12) = 1;
                  *(undefined1 *)((long)pvVar7 + uVar10) = 1;
                  break;
                }
                ppVar9 = ppVar9 + 1;
              }
            }
          }
          plVar14 = &players;
          for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
            if ((*(char *)((long)&n + lVar4) == '\0') && ((long *)*plVar14 != (long *)0x0)) {
              (**(code **)(*(long *)*plVar14 + 0x20))();
              *plVar14 = 0;
            }
            plVar14 = plVar14 + 0x54;
          }
          for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
            if (*(char *)((long)pvVar7 + uVar10) == '\0') {
              (*(ppVar13->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
              ppVar13->mo = (APlayerPawn *)0x0;
            }
            ppVar13 = ppVar13 + 1;
          }
        }
        operator_delete__(pvVar7);
        lVar4 = *puVar6 * 0x2a0;
        uVar11 = lVar4 + 8;
        uVar10 = *puVar6;
        while (uVar10 != 0) {
          player_t::~player_t((player_t *)((long)puVar6 + lVar4 + -0x298));
          lVar4 = lVar4 + -0x2a0;
          uVar10 = lVar4;
        }
        operator_delete__(puVar6,uVar11);
        operator_delete__(ppcVar5);
      }
      FSerializer::EndArray(arc);
    }
    if (((!skipload) && (numPlayers < iVar15)) && (deathmatch.Value == 0)) {
      puVar16 = &DAT_017dbf88;
      mthing = playerstarts;
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        if ((playeringame[lVar4] == true) && (*(long *)(puVar16 + -8) == 0)) {
          *puVar16 = 3;
          P_SpawnPlayer(mthing,(int)lVar4,level.flags2 >> 6 & 2);
        }
        mthing = mthing + 1;
        puVar16 = puVar16 + 0x2a0;
      }
    }
    player_t::SendPitchLimits((player_t *)(&players + (long)consoleplayer * 0x54));
  }
  else {
    FSerializer::operator()(arc,"numplayers",&local_2e4);
    bVar2 = FSerializer::BeginArray(arc,"players");
    if (bVar2) {
      ppVar13 = (player_t *)&players;
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        if ((playeringame[lVar4] == true) &&
           (bVar2 = FSerializer::BeginObject(arc,(char *)0x0), bVar2)) {
          n = userinfo_t::GetName(&ppVar13->userinfo);
          FSerializer::StringPtr(arc,"playername",&n);
          player_t::Serialize(ppVar13,arc);
          FSerializer::EndObject(arc);
        }
        ppVar13 = ppVar13 + 1;
      }
      FSerializer::EndArray(arc);
    }
  }
  return;
}

Assistant:

void P_SerializePlayers(FSerializer &arc, bool skipload)
{
	int numPlayers, numPlayersNow;
	int i;

	// Count the number of players present right now.
	for (numPlayersNow = 0, i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			++numPlayersNow;
		}
	}

	if (arc.isWriting())
	{
		// Record the number of players in this save.
		arc("numplayers", numPlayersNow);
		if (arc.BeginArray("players"))
		{
			// Record each player's name, followed by their data.
			for (i = 0; i < MAXPLAYERS; ++i)
			{
				if (playeringame[i])
				{
					if (arc.BeginObject(nullptr))
					{
						const char *n = players[i].userinfo.GetName();
						arc.StringPtr("playername", n);
						players[i].Serialize(arc);
						arc.EndObject();
					}
				}
			}
			arc.EndArray();
		}
	}
	else
	{
		arc("numplayers", numPlayers);

		if (arc.BeginArray("players"))
		{
			// If there is only one player in the game, they go to the
			// first player present, no matter what their name.
			if (numPlayers == 1)
			{
				ReadOnePlayer(arc, skipload);
			}
			else
			{
				ReadMultiplePlayers(arc, numPlayers, numPlayersNow, skipload);
			}
			arc.EndArray();
		}
		if (!skipload && numPlayersNow > numPlayers)
		{
			SpawnExtraPlayers();
		}
		// Redo pitch limits, since the spawned player has them at 0.
		players[consoleplayer].SendPitchLimits();
	}
}